

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_gamma_file3.hpp
# Opt level: O0

pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
* __thiscall
packed_gamma_file3<unsigned_int,_6UL>::run_length_encode
          (packed_gamma_file3<unsigned_int,_6UL> *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *V)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  value_type *__x;
  size_type sVar2;
  reference pvVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDX;
  pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *in_RDI;
  uint i;
  uint n;
  uint l;
  pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *R;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  value_type vVar4;
  undefined4 local_28;
  
  std::
  pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  ::
  pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_true>
            ((pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  local_28 = 0;
  do {
    this_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)local_28;
    pvVar1 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDX);
    if (pvVar1 <= this_00) {
      return in_RDI;
    }
    __x = (value_type *)(ulong)local_28;
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDX);
    if (__x == (value_type *)(sVar2 - 1)) {
LAB_0013b470:
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this_00,__x);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RDX,(ulong)local_28);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this_00,__x);
    }
    else {
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (in_RDX,(ulong)local_28);
      vVar4 = *pvVar3;
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (in_RDX,(ulong)(local_28 + 1));
      if (vVar4 != *pvVar3) goto LAB_0013b470;
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

pair<vector<itype>, vector<itype> > run_length_encode(vector<itype> & V){

		pair<vector<itype>, vector<itype> > R;
		itype l = 1;
		itype n = 0;

		for(itype i=0;i<V.size();++i){

			if(i == V.size()-1 || V[i] != V[i+1]){

				R.first.push_back(l);
				R.second.push_back(V[i]);

				n+=l;

				l = 1;

			}else{

				++l;

			}

		}

		assert(n == V.size());

		return R;

	}